

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O2

int claim_address(int sock,uint64_t name,int sa)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  uint8_t uVar3;
  sockaddr_can saddr;
  
  saddr.can_family = 0x1d;
  saddr.can_ifindex = if_nametoindex(s.intf);
  __stream = _stderr;
  saddr.can_addr.j1939.pgn = 0x40000;
  uVar3 = (uint8_t)sa;
  saddr.can_addr.j1939.name = name;
  saddr.can_addr.j1939.addr = uVar3;
  if (s.verbose != 0) {
    pcVar2 = libj1939_addr2str(&saddr);
    fprintf(__stream,"- bind(, %s, %zi);\n",pcVar2,0x18);
  }
  iVar1 = bind(sock,(sockaddr *)&saddr,0x18);
  if (-1 < iVar1) {
    s.last_sa = uVar3;
    iVar1 = repeat_address(sock,name);
    return iVar1;
  }
  err(1,"rebind with sa 0x%02x",sa);
}

Assistant:

static int claim_address(int sock, uint64_t name, int sa)
{
	int ret;
	struct sockaddr_can saddr = {
		.can_family = AF_CAN,
		.can_addr.j1939 = {
			.name = name,
			.addr = sa,
			.pgn = J1939_NO_PGN,
		},
		.can_ifindex = if_nametoindex(s.intf),
	};

	if (s.verbose)
		fprintf(stderr, "- bind(, %s, %zi);\n", libj1939_addr2str(&saddr), sizeof(saddr));
	ret = bind(sock, (void *)&saddr, sizeof(saddr));
	if (ret < 0)
		err(1, "rebind with sa 0x%02x", sa);
	s.last_sa = sa;
	return repeat_address(sock, name);
}